

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

SLabelTableEntry * __thiscall CLabelTable::Find(CLabelTable *this,char *name,bool onlyDefined)

{
  bool bVar1;
  pointer ppVar2;
  SLabelTableEntry *local_a0;
  _Self local_70 [3];
  allocator<char> local_51;
  key_type local_50;
  _Self local_30;
  iterator labelIt;
  bool onlyDefined_local;
  char *name_local;
  CLabelTable *this_local;
  
  labelIt._M_node._7_1_ = onlyDefined;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
       ::find(&this->symbols,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
       ::end(&this->symbols);
  bVar1 = std::operator==(local_70,&local_30);
  if (!bVar1) {
    if (((labelIt._M_node._7_1_ & 1) == 0) ||
       (ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>
                 ::operator->(&local_30), (ppVar2->second).page != -1)) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>
               ::operator->(&local_30);
      local_a0 = &ppVar2->second;
    }
    else {
      local_a0 = (SLabelTableEntry *)0x0;
    }
    return local_a0;
  }
  return (SLabelTableEntry *)0x0;
}

Assistant:

SLabelTableEntry* CLabelTable::Find(const char* name, bool onlyDefined) {
	symbol_map_t::iterator labelIt = symbols.find(name);
	if (symbols.end() == labelIt) return nullptr;
	return (onlyDefined && LABEL_PAGE_UNDEFINED == labelIt->second.page) ? nullptr : &labelIt->second;
}